

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O0

void __thiscall helics::Federate::enterInitializingModeComplete(Federate *this)

{
  string_view message;
  IterationResult iterating;
  bool bVar1;
  undefined8 uVar2;
  Federate *in_RDI;
  exception *anon_var_0;
  handle asyncInfo;
  shared_guarded<helics::AsyncFedCallInfo,_std::mutex> *in_stack_ffffffffffffff98;
  undefined6 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffae;
  size_t in_stack_ffffffffffffffb8;
  future<bool> *in_stack_ffffffffffffffc0;
  Federate *in_stack_ffffffffffffffe0;
  
  if ((in_RDI->singleThreadFederate & 1U) == 0) {
    iterating = std::atomic<helics::Federate::Modes>::load(&in_RDI->currentMode,seq_cst);
    if (iterating == NEXT_STEP) {
      enterInitializingMode(in_stack_ffffffffffffffe0);
    }
    else if (iterating != 1) {
      if (iterating != 5) {
        uVar2 = __cxa_allocate_exception(0x28);
        CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_RDI,
                   (char *)CONCAT17(iterating,
                                    CONCAT16(in_stack_ffffffffffffffae,in_stack_ffffffffffffffa8)));
        message._M_str = (char *)in_stack_ffffffffffffffc0;
        message._M_len = in_stack_ffffffffffffffb8;
        InvalidFunctionCall::InvalidFunctionCall((InvalidFunctionCall *)in_RDI,message);
        __cxa_throw(uVar2,&InvalidFunctionCall::typeinfo,InvalidFunctionCall::~InvalidFunctionCall);
      }
      std::
      unique_ptr<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
      ::operator->((unique_ptr<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
                    *)0x33fcf5);
      gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>::lock
                (in_stack_ffffffffffffff98);
      gmlc::libguarded::lock_handle<helics::AsyncFedCallInfo,_std::mutex>::operator->
                ((lock_handle<helics::AsyncFedCallInfo,_std::mutex> *)&stack0xffffffffffffffe0);
      bVar1 = std::future<bool>::get(in_stack_ffffffffffffffc0);
      if (bVar1) {
        enteringInitializingMode(in_RDI,iterating);
      }
      gmlc::libguarded::lock_handle<helics::AsyncFedCallInfo,_std::mutex>::~lock_handle
                ((lock_handle<helics::AsyncFedCallInfo,_std::mutex> *)0x33fda1);
    }
  }
  else {
    enterInitializingMode(in_stack_ffffffffffffffe0);
  }
  return;
}

Assistant:

void Federate::enterInitializingModeComplete()
{
    if (singleThreadFederate) {
        return enterInitializingMode();
    }
    switch (currentMode.load()) {
        case Modes::PENDING_INIT: {
            auto asyncInfo = asyncCallInfo->lock();
            try {
                if (asyncInfo->initFuture.get()) {
                    enteringInitializingMode(IterationResult::NEXT_STEP);
                }
            }
            catch (const std::exception&) {
                updateFederateMode(Modes::ERROR_STATE);
                throw;
            }
        } break;
        case Modes::INITIALIZING:
            break;
        case Modes::STARTUP:
            enterInitializingMode();
            break;
        default:
            throw(InvalidFunctionCall(
                "cannot call Initialization Complete function without first calling "
                "enterInitializingModeAsync function or being in startup mode"));
    }
}